

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O1

int get_layer_order(vector<int,_std::allocator<int>_> *layers,
                   map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                   *layer_info)

{
  _Rb_tree_color *p_Var1;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  _Self __tmp;
  mapped_type *pmVar4;
  ulong uVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_header *p_Var7;
  _Rb_tree_color _Var8;
  pointer piVar9;
  pointer piVar10;
  _Rb_tree_color *p_Var11;
  
  piVar10 = (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  for (piVar9 = (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar9 != piVar10; piVar9 = piVar9 + 1) {
    pmVar4 = std::
             map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
             ::operator[](layer_info,piVar9);
    *piVar9 = pmVar4->order;
    piVar10 = (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  piVar9 = (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar9 != piVar10) {
    uVar5 = (long)piVar10 - (long)piVar9 >> 2;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar9,piVar10,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar9,piVar10);
  }
  p_Var11 = (_Rb_tree_color *)
            (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  p_Var1 = (_Rb_tree_color *)
           (layers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (p_Var11 != p_Var1) {
    p_Var2 = (layer_info->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = &(layer_info->_M_t)._M_impl.super__Rb_tree_header;
    do {
      if ((_Rb_tree_header *)p_Var2 != p_Var7) {
        _Var8 = *p_Var11;
        p_Var6 = p_Var2;
        do {
          if (*(_Rb_tree_color *)((long)&p_Var6[2]._M_parent + 4) == _Var8) {
            _Var8 = p_Var6[1]._M_color;
            *p_Var11 = _Var8;
            p_Var6 = &p_Var7->_M_header;
          }
          else {
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          }
        } while ((_Rb_tree_header *)p_Var6 != p_Var7);
      }
      p_Var11 = p_Var11 + 1;
    } while (p_Var11 != p_Var1);
  }
  return 0;
}

Assistant:

int get_layer_order(vector<int> &layers, map<int, layer_data> &layer_info)
{
  // Translate layer numbers to order
  auto layer_it = layers.begin();
  while (layer_it != layers.end())
  {
    // int order = layer_info[*layer_it].order;
    *layer_it = layer_info[*layer_it].order;
    layer_it++;
  }
  sort(layers.begin(), layers.end());
  // Translate back to layer
  layer_it = layers.begin();
  while (layer_it != layers.end())
  {
    // search through map for matching order
    auto ldf_iter = layer_info.begin();
    while (ldf_iter != layer_info.end())
    {
      if (ldf_iter->second.order == *layer_it)
      {
        *layer_it = ldf_iter->first;
        ldf_iter = layer_info.end();
      }
      else
      {
        ldf_iter++;
      }
    }
    layer_it++;
  }
  return EXIT_SUCCESS;
}